

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void string_contains_stl_string(void)

{
  char *actual;
  string obbo;
  allocator *actual_string;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  allocator local_21;
  string local_20 [32];
  
  actual_string = &local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"obbo",actual_string);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  actual = (char *)cgreen::create_contains_string_constraint(local_20,"obbo");
  cgreen::assert_that_<char_const*>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)actual_string,actual,
             (Constraint *)0x11a4ef);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

Ensure(string_contains_stl_string) {
    std::string obbo("obbo");
    assert_that("bobbob", contains_string(obbo));
}